

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O3

void __thiscall
ktx::CommandCreate::generateMipLevels
          (CommandCreate *this,KTXTexture2 *texture,
          unique_ptr<Image,_std::default_delete<Image>_> *image,ImageInput *inputFile,
          uint32_t numMipLevels,uint32_t layerIndex,uint32_t faceIndex,uint32_t depthSliceIndex)

{
  Image *pIVar1;
  _Alloc_hider _Var2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ktx_error_code_e kVar7;
  char *__s;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar8
  ;
  uint uVar9;
  undefined4 in_register_0000008c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar10;
  ktx_uint32_t kVar11;
  string_view fmt;
  format_args args;
  undefined1 local_b8 [24];
  undefined8 uStack_a0;
  uint32_t local_98;
  uint32_t local_94;
  uint32_t local_90;
  uint32_t local_8c;
  undefined1 local_88 [32];
  KTXTexture2 *local_68;
  Reporter *local_60;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  ImageInput *local_50;
  ulong local_48 [3];
  
  aVar10._4_4_ = in_register_0000008c;
  aVar10._0_4_ = layerIndex;
  local_98 = numMipLevels;
  local_8c = layerIndex;
  local_68 = texture;
  local_50 = inputFile;
  bVar4 = isFormatINT(texture->handle_->vkFormat);
  if (bVar4) {
    uVar6 = local_68->handle_->vkFormat;
    __s = (char *)vkFormatString(uVar6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,__s,(allocator<char> *)local_48);
    iVar5 = std::__cxx11::string::compare(local_b8);
    if (iVar5 == 0) {
      fmt.size_ = 2;
      fmt.data_ = (char *)0xa;
      args.field_1.args_ = aVar10.args_;
      args.desc_ = (unsigned_long_long)local_48;
      local_48[0] = (ulong)uVar6;
      ::fmt::v10::vformat_abi_cxx11_((string *)local_88,(v10 *)0x20aba6,fmt,args);
      if ((Image *)local_b8._0_8_ != (Image *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
    }
    else {
      local_88._0_8_ = local_88 + 0x10;
      if ((Image *)local_b8._0_8_ == (Image *)(local_b8 + 0x10)) {
        local_88._24_8_ = uStack_a0;
      }
      else {
        local_88._0_8_ = local_b8._0_8_;
      }
      local_88._16_8_ = local_b8._16_8_;
      local_88._8_8_ = local_b8._8_8_;
    }
    Reporter::fatal<char_const(&)[63],std::__cxx11::string>
              (&(this->super_Command).super_Reporter,NOT_SUPPORTED,
               (char (*) [63])"Mipmap generation for SINT or UINT format {} is not supported.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    if ((Image *)local_88._0_8_ != (Image *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
  }
  if (1 < local_98) {
    pIVar1 = (image->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
             super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
             super__Head_base<0UL,_Image_*,_false>._M_head_impl;
    local_90 = pIVar1->width;
    local_94 = pIVar1->height;
    local_60 = &(this->super_Command).super_Reporter;
    kVar11 = 1;
    local_58 = &(this->options).super_OptionsCreate.mipmapFilter;
    do {
      pIVar1 = (image->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
               super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
               super__Head_base<0UL,_Image_*,_false>._M_head_impl;
      poVar8 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&(this->options).super_OptionsCreate.defaultMipmapFilter;
      if ((this->options).super_OptionsCreate.mipmapFilter.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged != false) {
        poVar8 = local_58;
      }
      local_b8._0_8_ = local_b8 + 0x10;
      _Var2._M_p = (poVar8->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,_Var2._M_p,
                 _Var2._M_p +
                 (poVar8->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_string_length);
      uVar6 = local_94 >> ((byte)kVar11 & 0x1f);
      uVar9 = local_90 >> ((byte)kVar11 & 0x1f);
      (*pIVar1->_vptr_Image[0x11])
                ((&(this->options).super_OptionsCreate.mipmapFilterScale)
                 [(this->options).super_OptionsCreate.mipmapFilterScale.
                  super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float>._M_engaged ^ 1].
                 super__Optional_base<float,_true,_true>._M_payload.
                 super__Optional_payload_base<float>._M_payload._M_value,local_88,pIVar1,
                 (ulong)(uVar9 + (uVar9 == 0)),(ulong)(uVar6 + (uVar6 == 0)),local_b8._0_8_,
                 (ulong)(&(this->options).super_OptionsCreate.mipmapWrap)
                        [(this->options).super_OptionsCreate.mipmapWrap.
                         super__Optional_base<basisu::Resampler::Boundary_Op,_true,_true>._M_payload
                         .super__Optional_payload_base<basisu::Resampler::Boundary_Op>._M_engaged ^
                         1].super__Optional_base<basisu::Resampler::Boundary_Op,_true,_true>.
                        _M_payload.super__Optional_payload_base<basisu::Resampler::Boundary_Op>.
                        _M_payload._M_value);
      uVar3 = local_88._0_8_;
      local_88._0_8_ = (long *)0x0;
      pIVar1 = (image->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
               super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
               super__Head_base<0UL,_Image_*,_false>._M_head_impl;
      (image->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
      super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
      super__Head_base<0UL,_Image_*,_false>._M_head_impl = (Image *)uVar3;
      if ((pIVar1 != (Image *)0x0) &&
         ((*pIVar1->_vptr_Image[1])(), (long *)local_88._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
      local_88._0_8_ = (Image *)0x0;
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      if ((this->options).super_OptionsCreate.normalize == true) {
        (*((image->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
           super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
           super__Head_base<0UL,_Image_*,_false>._M_head_impl)->_vptr_Image[0x14])();
      }
      convert((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,this,image,
              (this->options).super_OptionsCreate.vkFormat,local_50);
      kVar7 = (*local_68->handle_->vtbl->SetImageFromMemory)
                        ((ktxTexture *)local_68->handle_,kVar11,local_8c,faceIndex + depthSliceIndex
                         ,(ktx_uint8_t *)local_b8._0_8_,local_b8._8_8_ - local_b8._0_8_);
      if (kVar7 != KTX_SUCCESS) {
        __assert_fail("ret == KTX_SUCCESS && \"Internal error\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                      ,0x9f7,
                      "void ktx::CommandCreate::generateMipLevels(KTXTexture2 &, std::unique_ptr<Image>, ImageInput &, uint32_t, uint32_t, uint32_t, uint32_t)"
                     );
      }
      if ((ktx_uint8_t *)local_b8._0_8_ != (ktx_uint8_t *)0x0) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
      }
      kVar11 = kVar11 + 1;
    } while (local_98 != kVar11);
  }
  return;
}

Assistant:

void CommandCreate::generateMipLevels(KTXTexture2& texture, std::unique_ptr<Image> image, ImageInput& inputFile,
        uint32_t numMipLevels, uint32_t layerIndex, uint32_t faceIndex, uint32_t depthSliceIndex) {

    if (isFormatINT(static_cast<VkFormat>(texture->vkFormat)))
        fatal(rc::NOT_SUPPORTED, "Mipmap generation for SINT or UINT format {} is not supported.",
              toString(static_cast<VkFormat>(texture->vkFormat)));

    const auto baseWidth = image->getWidth();
    const auto baseHeight = image->getHeight();

    for (uint32_t mipLevelIndex = 1; mipLevelIndex < numMipLevels; ++mipLevelIndex) {
        const auto mipImageWidth = std::max(1u, baseWidth >> (mipLevelIndex));
        const auto mipImageHeight = std::max(1u, baseHeight >> (mipLevelIndex));

        try {
            image = image->resample(mipImageWidth, mipImageHeight,
                    options.mipmapFilter.value_or(options.defaultMipmapFilter).c_str(),
                    options.mipmapFilterScale.value_or(options.defaultMipmapFilterScale),
                    options.mipmapWrap.value_or(options.defaultMipmapWrap));
        } catch (const std::exception& e) {
            fatal(rc::RUNTIME_ERROR, "Mipmap generation failed: {}", e.what());
        }

        if (options.normalize)
            image->normalize();

        const auto imageData = convert(image, options.vkFormat, inputFile);

        const auto ret = ktxTexture_SetImageFromMemory(
                texture,
                mipLevelIndex,
                layerIndex,
                faceIndex + depthSliceIndex, // Faces and Depths are mutually exclusive, Addition is acceptable
                imageData.data(),
                imageData.size());
        assert(ret == KTX_SUCCESS && "Internal error"); (void) ret;
    }
}